

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O1

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SqrtOp>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 local_38 [16];
  
  fVar8 = 0.0;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar2 = state->m_shaderParams->maxExpressionDepth;
    iVar3 = state->m_expressionDepth;
    iVar5 = getConservativeValueExprDepth(state,valueRange);
    fVar8 = 0.0;
    if (iVar5 + 1 <= iVar2 - iVar3) {
      if ((valueRange.m_type)->m_numElements < 1) {
        fVar8 = 1.0;
      }
      else {
        fVar8 = 1.0;
        lVar6 = 0;
        do {
          VariableType::getElementType(valueRange.m_type);
          fVar12 = valueRange.m_min[lVar6].floatVal;
          VariableType::getElementType(valueRange.m_type);
          fVar10 = 1.0;
          if (-INFINITY < fVar12) {
            fVar1 = valueRange.m_max[lVar6].floatVal;
            fVar10 = 1.0;
            if (fVar1 < INFINITY) {
              bVar4 = 0.0 <= fVar1;
              fVar7 = (float)-(uint)bVar4;
              if (fVar12 <= 4.0 && bVar4) {
                fVar7 = (float)(-(uint)(0.0 <= fVar12) & (uint)fVar12);
                fVar10 = fVar1;
                if (4.0 <= fVar1) {
                  fVar10 = 4.0;
                }
                fVar7 = fVar7 * fVar7;
                local_38 = ZEXT416((uint)(fVar10 * fVar10));
              }
              fVar10 = 0.0;
              if (fVar12 <= 4.0 && bVar4) {
                fVar9 = ceilf(fVar7 * 8.0);
                fVar9 = fVar9 * 0.125;
                fVar11 = (float)local_38._0_4_;
                if (fVar9 <= (float)local_38._0_4_) {
                  fVar10 = floorf((float)local_38._0_4_ * 8.0);
                  bVar4 = fVar9 <= fVar10 * 0.125;
                  if (bVar4) {
                    bVar4 = true;
                    fVar11 = fVar10 * 0.125;
                  }
                }
                else {
                  bVar4 = false;
                  fVar9 = fVar7;
                }
                fVar10 = 0.0;
                if (bVar4) {
                  if ((fVar12 != fVar1) || (fVar10 = 1.0, NAN(fVar12) || NAN(fVar1))) {
                    if (fVar11 < 0.0) {
                      fVar11 = sqrtf(fVar11);
                    }
                    else {
                      fVar11 = SQRT(fVar11);
                    }
                    if (fVar9 < 0.0) {
                      local_38._0_4_ = fVar11;
                      fVar9 = sqrtf(fVar9);
                    }
                    else {
                      fVar9 = SQRT(fVar9);
                    }
                    fVar12 = (fVar11 - fVar9) / (fVar1 - fVar12);
                    fVar10 = 0.1;
                    if (0.1 <= fVar12) {
                      fVar10 = fVar12;
                    }
                  }
                }
              }
            }
          }
          fVar8 = fVar8 * fVar10;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (valueRange.m_type)->m_numElements);
      }
    }
  }
  return fVar8;
}

Assistant:

static inline void computeValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		DE_VERIFY(C::transformValueRange(outMin, outMax, inMin, inMax));
		DE_VERIFY(quantizeFloatRange(inMin, inMax));
		DE_ASSERT(inMin <= inMax);
	}